

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O1

int __thiscall
anon_unknown.dwarf_38a::NinjaMain::ToolQuery(NinjaMain *this,Options *options,int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  Node *pNVar3;
  pointer ppNVar4;
  Edge *pEVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  pointer ppEVar10;
  string err;
  DyndepLoader dyndep_loader;
  bool local_89;
  string local_88;
  ulong local_68;
  NinjaMain *local_60;
  char **local_58;
  Node *local_50;
  ulong local_48;
  DyndepLoader local_40;
  
  local_58 = argv;
  if (argc == 0) {
    Error("expected a target to query");
    uVar2 = 1;
  }
  else {
    local_40.state_ = &this->state_;
    local_40.disk_interface_ = &(this->disk_interface_).super_DiskInterface;
    local_89 = 0 < argc;
    if (0 < argc) {
      local_68 = (ulong)(uint)argc;
      local_48 = 0;
      local_60 = this;
      do {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        local_88._M_string_length = 0;
        local_88.field_2._M_local_buf[0] = '\0';
        pNVar3 = CollectTarget(local_60,local_58[local_48],&local_88);
        if (pNVar3 == (Node *)0x0) {
          Error("%s",local_88._M_dataplus._M_p);
        }
        else {
          printf("%s:\n",(pNVar3->path_)._M_dataplus._M_p);
          pEVar5 = pNVar3->in_edge_;
          local_50 = pNVar3;
          if (pEVar5 != (Edge *)0x0) {
            pNVar3 = pEVar5->dyndep_;
            if (((pNVar3 != (Node *)0x0) && (pNVar3->dyndep_pending_ == true)) &&
               (bVar1 = DyndepLoader::LoadDyndeps(&local_40,pNVar3,&local_88), !bVar1)) {
              Warning("%s\n",local_88._M_dataplus._M_p);
            }
            printf("  input: %s\n",(pEVar5->rule_->name_)._M_dataplus._M_p);
            ppNVar4 = (pEVar5->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (0 < (int)((ulong)((long)(pEVar5->inputs_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)ppNVar4) >> 3)) {
              uVar9 = 0;
              do {
                lVar6 = (long)(pEVar5->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar4 >> 3;
                pcVar8 = "|| ";
                pcVar7 = "|| ";
                if (uVar9 < (ulong)(lVar6 - pEVar5->order_only_deps_)) {
                  pcVar7 = "";
                  pcVar8 = "| ";
                }
                if (uVar9 < (ulong)(lVar6 - ((long)pEVar5->implicit_deps_ +
                                            (long)pEVar5->order_only_deps_))) {
                  pcVar8 = pcVar7;
                }
                printf("    %s%s\n",pcVar8,(ppNVar4[uVar9]->path_)._M_dataplus._M_p);
                uVar9 = uVar9 + 1;
                ppNVar4 = (pEVar5->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              } while ((long)uVar9 <
                       (long)(int)((ulong)((long)(pEVar5->inputs_).
                                                 super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ppNVar4) >> 3));
            }
          }
          puts("  outputs:");
          pNVar3 = local_50;
          ppEVar10 = (local_50->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          if (ppEVar10 !=
              (local_50->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            do {
              pEVar5 = *ppEVar10;
              for (ppNVar4 = (pEVar5->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  ppNVar4 !=
                  (pEVar5->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish; ppNVar4 = ppNVar4 + 1) {
                printf("    %s\n",((*ppNVar4)->path_)._M_dataplus._M_p);
                pEVar5 = *ppEVar10;
              }
              ppEVar10 = ppEVar10 + 1;
            } while (ppEVar10 !=
                     (pNVar3->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,
                          CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                   local_88.field_2._M_local_buf[0]) + 1);
        }
        if (pNVar3 == (Node *)0x0) break;
        local_48 = local_48 + 1;
        local_89 = local_48 < local_68;
      } while (local_48 != local_68);
    }
    uVar2 = (uint)local_89;
  }
  return uVar2;
}

Assistant:

int NinjaMain::ToolQuery(const Options* options, int argc, char* argv[]) {
  if (argc == 0) {
    Error("expected a target to query");
    return 1;
  }

  DyndepLoader dyndep_loader(&state_, &disk_interface_);

  for (int i = 0; i < argc; ++i) {
    string err;
    Node* node = CollectTarget(argv[i], &err);
    if (!node) {
      Error("%s", err.c_str());
      return 1;
    }

    printf("%s:\n", node->path().c_str());
    if (Edge* edge = node->in_edge()) {
      if (edge->dyndep_ && edge->dyndep_->dyndep_pending()) {
        if (!dyndep_loader.LoadDyndeps(edge->dyndep_, &err)) {
          Warning("%s\n", err.c_str());
        }
      }
      printf("  input: %s\n", edge->rule_->name().c_str());
      for (int in = 0; in < (int)edge->inputs_.size(); in++) {
        const char* label = "";
        if (edge->is_implicit(in))
          label = "| ";
        else if (edge->is_order_only(in))
          label = "|| ";
        printf("    %s%s\n", label, edge->inputs_[in]->path().c_str());
      }
    }
    printf("  outputs:\n");
    for (vector<Edge*>::const_iterator edge = node->out_edges().begin();
         edge != node->out_edges().end(); ++edge) {
      for (vector<Node*>::iterator out = (*edge)->outputs_.begin();
           out != (*edge)->outputs_.end(); ++out) {
        printf("    %s\n", (*out)->path().c_str());
      }
    }
  }
  return 0;
}